

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stdio.cpp
# Opt level: O2

int main(void)

{
  _Alloc_hider __old;
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  string local_210 [32];
  string example;
  ostringstream ss;
  char buf [16];
  wstring wexample;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example,anon_var_dwarf_3c5b,(allocator<char> *)&ss);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&wexample,L"ש-м-ν.txt",(allocator<wchar_t> *)&ss);
  pFVar2 = fopen(example._M_dataplus._M_p,"w");
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,"Error f in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1e);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_210);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fwrite("test\n",5,1,pFVar2);
  fclose(pFVar2);
  pFVar2 = fopen(example._M_dataplus._M_p,"r");
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,"Error (f=nowide::fopen(example.c_str(),\"r\"))!=0 in ")
    ;
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x23);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_210);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = fgets(buf,0x10,pFVar2);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,"Error std::fgets(buf,16,f)!=0 in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x25);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_210);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = bcmp(buf,"test\n",6);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,"Error strcmp(buf,\"test\\n\")==0 in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x26);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_210);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pFVar2 = freopen(example._M_dataplus._M_p,"r+",pFVar2);
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,
                             "Error (f=nowide::freopen(example.c_str(),\"r+\",f))!=0 in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x27);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_210);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fclose(pFVar2);
  __old = example._M_dataplus;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,&example,
                 ".1");
  iVar1 = rename(__old._M_p,_ss);
  std::__cxx11::string::~string((string *)&ss);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,
                             "Error nowide::rename(example.c_str(),(example+\".1\").c_str())==0 in "
                            );
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2b);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_210);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = remove(example._M_dataplus._M_p);
  if (-1 < iVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,"Error nowide::remove(example.c_str())<0 in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2c);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_210);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,&example,
                 ".1");
  pFVar2 = fopen(_ss,"r");
  std::__cxx11::string::~string((string *)&ss);
  if (pFVar2 != (FILE *)0x0) {
    fclose(pFVar2);
    iVar1 = remove(example._M_dataplus._M_p);
    if (-1 < iVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar4 = std::operator<<((ostream *)&ss,"Error nowide::remove(example.c_str())<0 in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x30);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_210);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,&example
                   ,".1");
    iVar1 = remove(_ss);
    std::__cxx11::string::~string((string *)&ss);
    if (iVar1 == 0) {
      std::__cxx11::wstring::~wstring((wstring *)&wexample);
      std::__cxx11::string::~string((string *)&example);
      poVar4 = std::operator<<((ostream *)&std::cout,"Ok");
      std::endl<char,std::char_traits<char>>(poVar4);
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,"Error nowide::remove((example+\".1\").c_str())==0 in ")
    ;
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x31);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_210);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar4 = std::operator<<((ostream *)&ss,
                           "Error (f=nowide::fopen((example+\".1\").c_str(),\"r\"))!=0 in ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                          );
  poVar4 = std::operator<<(poVar4,':');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2d);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,"main");
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,local_210);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd.txt";
        std::wstring wexample = L"\u05e9-\u043c-\u03bd.txt";

        #ifdef NOWIDE_WINDOWS
        FILE *f=_wfopen(wexample.c_str(),L"w");
        #else
        FILE *f=std::fopen(example.c_str(),"w");
        #endif
        TEST(f);
        std::fprintf(f,"test\n");
        std::fclose(f);
        f=0;
        
        TEST((f=nowide::fopen(example.c_str(),"r"))!=0);
        char buf[16];
        TEST(std::fgets(buf,16,f)!=0);
        TEST(strcmp(buf,"test\n")==0);
        TEST((f=nowide::freopen(example.c_str(),"r+",f))!=0);
        std::fclose(f);
        f=0;
        
        TEST(nowide::rename(example.c_str(),(example+".1").c_str())==0);
        TEST(nowide::remove(example.c_str())<0);
        TEST((f=nowide::fopen((example+".1").c_str(),"r"))!=0);
        std::fclose(f);
        f=0;
        TEST(nowide::remove(example.c_str())<0);
        TEST(nowide::remove((example+".1").c_str())==0);
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
    std::cout << "Ok" << std::endl;
    return 0;
}